

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O1

BoundFunction *
Js::BoundFunction::InflateBoundFunction
          (ScriptContext *ctx,RecyclableObject *function,Var bThis,uint32 ct,Type *args)

{
  Recycler *alloc;
  BoundFunction *this;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  local_60 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5f772cc;
  data.filename._0_4_ = 0x193;
  data._32_8_ = function;
  alloc = Memory::Recycler::TrackAllocInfo(ctx->recycler,(TrackAllocData *)local_60);
  this = (BoundFunction *)new<Memory::Recycler>(0x50,alloc,0x38bbb2);
  BoundFunction(this,(((ctx->super_ScriptContextBase).javascriptLibrary)->boundFunctionType).ptr);
  Memory::Recycler::WBSetBit((char *)&this->boundThis);
  (this->boundThis).ptr = bThis;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->boundThis);
  this->count = ct;
  Memory::Recycler::WBSetBit((char *)&this->boundArgs);
  (this->boundArgs).ptr = args;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->boundArgs);
  Memory::Recycler::WBSetBit((char *)&this->targetFunction);
  (this->targetFunction).ptr = (RecyclableObject *)data._32_8_;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->targetFunction);
  return this;
}

Assistant:

BoundFunction* BoundFunction::InflateBoundFunction(
        ScriptContext* ctx, RecyclableObject* function, Var bThis, uint32 ct, Field(Var)* args)
    {
        BoundFunction* res = RecyclerNew(ctx->GetRecycler(), BoundFunction, ctx->GetLibrary()->GetBoundFunctionType());

        res->boundThis = bThis;
        res->count = ct;
        res->boundArgs = args;

        res->targetFunction = function;

        return res;
    }